

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.cc
# Opt level: O2

void __thiscall rcg::GenTLException::~GenTLException(GenTLException *this)

{
  *(undefined ***)this = &PTR__GenTLException_00133c48;
  std::__cxx11::string::~string((string *)&this->s);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

GenTLException::~GenTLException()
{ }